

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O3

void __thiscall Func::SetFirstArgOffset(Func *this,Instr *inlineeStart)

{
  int iVar1;
  Opnd *pOVar2;
  _func_int **pp_Var3;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  undefined4 *puVar7;
  Instr *pIVar8;
  JITTimeFunctionBody *this_00;
  int iVar9;
  
  if (inlineeStart->m_func != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x301,"(inlineeStart->m_func == this)","inlineeStart->m_func == this");
    if (!bVar5) goto LAB_0042787c;
    *puVar7 = 0;
  }
  if (this->parentFunc == (Func *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x302,"(!IsTopFunc())","!IsTopFunc()");
    if (!bVar5) goto LAB_0042787c;
    *puVar7 = 0;
  }
  pIVar8 = IR::Instr::GetNextArg(inlineeStart);
  if (pIVar8 == (Instr *)0x0) {
    this_00 = JITTimeWorkItem::GetJITFunctionBody(this->topFunc->m_workItem);
    bVar5 = JITTimeFunctionBody::IsAsmJsMode(this_00);
    iVar9 = -0x10;
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x318,"(this->GetTopFunc()->GetJITFunctionBody()->IsAsmJsMode())",
                         "this->GetTopFunc()->GetJITFunctionBody()->IsAsmJsMode()");
      if (!bVar5) goto LAB_0042787c;
      *puVar7 = 0;
    }
  }
  else {
    pOVar2 = pIVar8->m_dst;
    OVar6 = IR::Opnd::GetKind(pOVar2);
    if (OVar6 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar5) goto LAB_0042787c;
      *puVar7 = 0;
    }
    pp_Var3 = pOVar2[1]._vptr_Opnd;
    if (*(char *)((long)pp_Var3 + 0x14) != '\x01') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar5) goto LAB_0042787c;
      *puVar7 = 0;
    }
    iVar9 = *(int *)(pp_Var3 + 4);
    if (((ulong)pp_Var3[3] & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x30a,"(lastArgOutStackSym->m_isSingleDef)",
                         "lastArgOutStackSym->m_isSingleDef");
      if (!bVar5) goto LAB_0042787c;
      *puVar7 = 0;
    }
    pOVar2 = *(Opnd **)(pp_Var3[5] + 0x50);
    OVar6 = IR::Opnd::GetKind(pOVar2);
    if (OVar6 == OpndKindSym) {
      OVar6 = IR::Opnd::GetKind(pOVar2);
      if (OVar6 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar5) goto LAB_0042787c;
        *puVar7 = 0;
      }
      pp_Var3 = pOVar2[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var3 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar5) goto LAB_0042787c;
        *puVar7 = 0;
      }
      iVar1 = *(int *)(pp_Var3 + 4);
      if (iVar9 < iVar1) {
        iVar9 = iVar1;
      }
    }
    iVar9 = iVar9 + -0x10;
  }
  iVar9 = iVar9 + (uint)this->actualCount * -8;
  if ((this->firstActualStackOffset != -1) && (this->firstActualStackOffset != iVar9)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x31c,
                       "((this->firstActualStackOffset == -1) || (this->firstActualStackOffset == firstActualStackOffset))"
                       ,
                       "(this->firstActualStackOffset == -1) || (this->firstActualStackOffset == firstActualStackOffset)"
                      );
    if (!bVar5) {
LAB_0042787c:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  this->firstActualStackOffset = iVar9;
  return;
}

Assistant:

void Func::SetFirstArgOffset(IR::Instr* inlineeStart)
{
    Assert(inlineeStart->m_func == this);
    Assert(!IsTopFunc());
    int32 lastOffset;

    IR::Instr* arg = inlineeStart->GetNextArg();
    if (arg)
    {
        const auto lastArgOutStackSym = arg->GetDst()->AsSymOpnd()->m_sym->AsStackSym();
        lastOffset = lastArgOutStackSym->m_offset;
        Assert(lastArgOutStackSym->m_isSingleDef);
        const auto secondLastArgOutOpnd = lastArgOutStackSym->m_instrDef->GetSrc2();
        if (secondLastArgOutOpnd->IsSymOpnd())
        {
            const auto secondLastOffset = secondLastArgOutOpnd->AsSymOpnd()->m_sym->AsStackSym()->m_offset;
            if (secondLastOffset > lastOffset)
            {
                lastOffset = secondLastOffset;
            }
        }
        lastOffset += MachPtr;
    }
    else
    {
        Assert(this->GetTopFunc()->GetJITFunctionBody()->IsAsmJsMode());
        lastOffset = MachPtr;
    }
    int32 firstActualStackOffset = lastOffset - ((this->actualCount + Js::Constants::InlineeMetaArgCount) * MachPtr);
    Assert((this->firstActualStackOffset == -1) || (this->firstActualStackOffset == firstActualStackOffset));
    this->firstActualStackOffset = firstActualStackOffset;
}